

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

int __thiscall
dlib::mfp_kernel_1_base_class<3UL>::
mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
::clone(mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int extraout_EAX;
  mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
  *unaff_retaddr;
  
  mp_impl_T(unaff_retaddr,this,
            *(mfp_pointer_type *)&(this->super_mp_impl<dlib::image_window>).field_0x20);
  return extraout_EAX;
}

Assistant:

void clone   (void* ptr) const  { new(ptr) mp_impl_T(this->o,this->callback); }